

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.h
# Opt level: O2

void Merge(cbtDbvtAabbMm *a,cbtDbvtAabbMm *b,cbtDbvtAabbMm *r)

{
  undefined1 auVar1 [16];
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    auVar1 = vminss_avx(ZEXT416((uint)(a->mi).m_floats[lVar2]),
                        ZEXT416((uint)(b->mi).m_floats[lVar2]));
    (r->mi).m_floats[lVar2] = auVar1._0_4_;
    auVar1 = vmaxss_avx(ZEXT416((uint)(a->mx).m_floats[lVar2]),
                        ZEXT416((uint)(b->mx).m_floats[lVar2]));
    (r->mx).m_floats[lVar2] = auVar1._0_4_;
  }
  return;
}

Assistant:

DBVT_INLINE void Merge(const cbtDbvtAabbMm& a,
					   const cbtDbvtAabbMm& b,
					   cbtDbvtAabbMm& r)
{
#if DBVT_MERGE_IMPL == DBVT_IMPL_SSE
	__m128 ami(_mm_load_ps(a.mi));
	__m128 amx(_mm_load_ps(a.mx));
	__m128 bmi(_mm_load_ps(b.mi));
	__m128 bmx(_mm_load_ps(b.mx));
	ami = _mm_min_ps(ami, bmi);
	amx = _mm_max_ps(amx, bmx);
	_mm_store_ps(r.mi, ami);
	_mm_store_ps(r.mx, amx);
#else
	for (int i = 0; i < 3; ++i)
	{
		if (a.mi[i] < b.mi[i])
			r.mi[i] = a.mi[i];
		else
			r.mi[i] = b.mi[i];
		if (a.mx[i] > b.mx[i])
			r.mx[i] = a.mx[i];
		else
			r.mx[i] = b.mx[i];
	}
#endif
}